

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O1

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrSceneObjectMSFT *value,string *prefix
               ,string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  XrSceneObjectTypeMSFT XVar3;
  pointer pcVar4;
  XrSceneObjectTypeMSFT __val;
  uint uVar5;
  char *pcVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  uint __len;
  string objecttype_prefix;
  string __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  local_50._M_dataplus._M_p = (pointer)value;
  std::__cxx11::string::_M_construct((ulong)&local_70,'\x12');
  *local_70._M_dataplus._M_p = '0';
  local_70._M_dataplus._M_p[1] = 'x';
  pcVar6 = local_70._M_dataplus._M_p + (local_70._M_string_length - 1);
  lVar8 = 0;
  do {
    bVar2 = *(byte *)((long)&local_50._M_dataplus._M_p + lVar8);
    *pcVar6 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 & 0xf];
    pcVar6[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 >> 4];
    lVar8 = lVar8 + 1;
    pcVar6 = pcVar6 + -2;
  } while (lVar8 != 8);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)prefix);
  pcVar4 = (prefix->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar4,pcVar4 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_70);
  XVar3 = value->objectType;
  __val = -XVar3;
  if (~XR_SCENE_OBJECT_TYPE_UNCATEGORIZED_MSFT < XVar3) {
    __val = XVar3;
  }
  __len = 1;
  if (9 < (uint)__val) {
    uVar9 = (ulong)(uint)__val;
    uVar5 = 4;
    do {
      __len = uVar5;
      uVar7 = (uint)uVar9;
      if (uVar7 < 100) {
        __len = __len - 2;
        goto LAB_00188237;
      }
      if (uVar7 < 1000) {
        __len = __len - 1;
        goto LAB_00188237;
      }
      if (uVar7 < 10000) goto LAB_00188237;
      uVar9 = uVar9 / 10000;
      uVar5 = __len + 4;
    } while (99999 < uVar7);
    __len = __len + 1;
  }
LAB_00188237:
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_50,(char)__len - (char)(XVar3 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_50._M_dataplus._M_p + ((uint)XVar3 >> 0x1f),__len,__val);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[22],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [22])"XrSceneObjectTypeMSFT",&local_70,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrSceneObjectMSFT* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string objecttype_prefix = prefix;
        objecttype_prefix += "objectType";
        contents.emplace_back("XrSceneObjectTypeMSFT", objecttype_prefix, std::to_string(value->objectType));
        return true;
    } catch(...) {
    }
    return false;
}